

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O1

shared_ptr<duckdb::ExtraTypeInfo,_true> __thiscall
duckdb::ExtraTypeInfo::Deserialize(ExtraTypeInfo *this,Deserializer *deserializer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  undefined8 uVar2;
  ExtraTypeInfoType EVar3;
  int iVar4;
  ExtraTypeInfo *pEVar5;
  SerializationException *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  ExtraTypeInfo *__tmp;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sVar7;
  ExtraTypeInfoType type;
  string str;
  unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
  extension_info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> alias;
  ExtraTypeInfoType local_89;
  shared_ptr<duckdb::ExtraTypeInfo,_true> local_88;
  undefined1 local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_50 [16];
  _Alloc_hider local_40;
  element_type *local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_78,deserializer);
    EVar3 = EnumUtil::FromString<duckdb::ExtraTypeInfoType>((char *)local_78);
    if (local_78 != (undefined1  [8])&local_68) {
      operator_delete((void *)local_78);
    }
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    EVar3 = (ExtraTypeInfoType)iVar4;
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  local_89 = EVar3;
  iVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"alias");
  if ((char)iVar4 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_68._M_local_buf[0] = '\0';
    local_40._M_p = (pointer)&local_30;
    local_30._M_local_buf[0] = '\0';
    local_30._1_8_ = local_68._1_8_;
    local_30._9_4_ = local_68._9_4_;
    local_30._13_2_ = local_68._13_2_;
    local_30._M_local_buf[0xf] = local_68._M_local_buf[0xf];
    local_38 = (element_type *)0x0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_40,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  Deserializer::ReadDeletedProperty<duckdb::vector<duckdb::Value,true>>
            (deserializer,0x66,"modifiers");
  iVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x67,"extension_info");
  if ((char)iVar4 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_50._0_8_ = (pointer)0x0;
    _Var6._M_pi = extraout_RDX_00;
  }
  else {
    Deserializer::
    Read<duckdb::unique_ptr<duckdb::ExtensionTypeInfo,std::default_delete<duckdb::ExtensionTypeInfo>,true>,duckdb::ExtensionTypeInfo>
              ((Deserializer *)local_50);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
    _Var6._M_pi = extraout_RDX;
  }
  local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  switch(local_89) {
  case INVALID_TYPE_INFO:
    this->_vptr_ExtraTypeInfo = (_func_int **)0x0;
    *(undefined8 *)&this->type = 0;
    goto LAB_01783b52;
  case GENERIC_TYPE_INFO:
    local_78 = (undefined1  [8])0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::ExtraTypeInfo,std::allocator<duckdb::ExtraTypeInfo>,duckdb::ExtraTypeInfoType&>
              (&_Stack_70,(ExtraTypeInfo **)local_78,
               (allocator<duckdb::ExtraTypeInfo> *)(local_50 + 0xf),&local_89);
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_78;
    _Var6._M_pi = _Stack_70._M_pi;
    if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Stack_70._M_pi)->_M_use_count = (_Stack_70._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Stack_70._M_pi)->_M_use_count = (_Stack_70._M_pi)->_M_use_count + 1;
      }
    }
    this_02._M_pi =
         local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
      this_02._M_pi =
           local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    }
    goto LAB_01783af4;
  case DECIMAL_TYPE_INFO:
    DecimalTypeInfo::Deserialize((DecimalTypeInfo *)local_78,deserializer);
    break;
  case STRING_TYPE_INFO:
    StringTypeInfo::Deserialize((StringTypeInfo *)local_78,deserializer);
    break;
  case LIST_TYPE_INFO:
    ListTypeInfo::Deserialize((ListTypeInfo *)local_78,deserializer);
    break;
  case STRUCT_TYPE_INFO:
    StructTypeInfo::Deserialize((StructTypeInfo *)local_78,deserializer);
    break;
  case ENUM_TYPE_INFO:
    EnumTypeInfo::Deserialize((EnumTypeInfo *)local_78,deserializer);
    break;
  case USER_TYPE_INFO:
    UserTypeInfo::Deserialize((UserTypeInfo *)local_78,deserializer);
    break;
  case AGGREGATE_STATE_TYPE_INFO:
    AggregateStateTypeInfo::Deserialize((AggregateStateTypeInfo *)local_78,deserializer);
    break;
  case ARRAY_TYPE_INFO:
    ArrayTypeInfo::Deserialize((ArrayTypeInfo *)local_78,deserializer);
    break;
  case ANY_TYPE_INFO:
    AnyTypeInfo::Deserialize((AnyTypeInfo *)local_78,deserializer);
    break;
  case INTEGER_LITERAL_TYPE_INFO:
    IntegerLiteralTypeInfo::Deserialize((IntegerLiteralTypeInfo *)local_78,deserializer);
    break;
  default:
    this_01 = (SerializationException *)__cxa_allocate_exception(0x10);
    local_78 = (undefined1  [8])&local_68;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,"Unsupported type for deserialization of ExtraTypeInfo!","");
    SerializationException::SerializationException(this_01,(string *)local_78);
    __cxa_throw(this_01,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  }
  _Var6._M_pi = _Stack_70._M_pi;
  local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_78;
  this_00._M_pi =
       local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  local_78 = (undefined1  [8])0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  this_02._M_pi = _Stack_70._M_pi;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_88.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var6._M_pi = local_88.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    this_02._M_pi = _Stack_70._M_pi;
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_88.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    _Var6._M_pi = local_88.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
  }
LAB_01783af4:
  local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)paVar1;
  if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
  }
  pEVar5 = shared_ptr<duckdb::ExtraTypeInfo,_true>::operator->(&local_88);
  ::std::__cxx11::string::operator=((string *)&pEVar5->alias,(string *)&local_40);
  pEVar5 = shared_ptr<duckdb::ExtraTypeInfo,_true>::operator->(&local_88);
  uVar2 = local_50._0_8_;
  local_50._0_8_ = (pointer)0x0;
  std::__uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>::
  reset((__uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
         *)&pEVar5->extension_info,(pointer)uVar2);
  *(undefined8 *)&this->type = 0;
  this->_vptr_ExtraTypeInfo =
       (_func_int **)
       local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->type =
       local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  _Var6._M_pi = extraout_RDX_01;
LAB_01783b52:
  uVar2 = local_50._0_8_;
  local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  if ((pointer)local_50._0_8_ != (pointer)0x0) {
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_50._0_8_ + 0x18));
    ::std::vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>::
    ~vector((vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
            uVar2);
    operator_delete((void *)uVar2);
    _Var6._M_pi = extraout_RDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p);
    _Var6._M_pi = extraout_RDX_03;
  }
  sVar7.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var6._M_pi;
  sVar7.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this
  ;
  return (shared_ptr<duckdb::ExtraTypeInfo,_true>)
         sVar7.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ExtraTypeInfo> ExtraTypeInfo::Deserialize(Deserializer &deserializer) {
	auto type = deserializer.ReadProperty<ExtraTypeInfoType>(100, "type");
	auto alias = deserializer.ReadPropertyWithDefault<string>(101, "alias");
	deserializer.ReadDeletedProperty<vector<Value>>(102, "modifiers");
	auto extension_info = deserializer.ReadPropertyWithDefault<unique_ptr<ExtensionTypeInfo>>(103, "extension_info");
	shared_ptr<ExtraTypeInfo> result;
	switch (type) {
	case ExtraTypeInfoType::AGGREGATE_STATE_TYPE_INFO:
		result = AggregateStateTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::ANY_TYPE_INFO:
		result = AnyTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::ARRAY_TYPE_INFO:
		result = ArrayTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::DECIMAL_TYPE_INFO:
		result = DecimalTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::ENUM_TYPE_INFO:
		result = EnumTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::GENERIC_TYPE_INFO:
		result = make_shared_ptr<ExtraTypeInfo>(type);
		break;
	case ExtraTypeInfoType::INTEGER_LITERAL_TYPE_INFO:
		result = IntegerLiteralTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::INVALID_TYPE_INFO:
		return nullptr;
	case ExtraTypeInfoType::LIST_TYPE_INFO:
		result = ListTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::STRING_TYPE_INFO:
		result = StringTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::STRUCT_TYPE_INFO:
		result = StructTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::USER_TYPE_INFO:
		result = UserTypeInfo::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of ExtraTypeInfo!");
	}
	result->alias = std::move(alias);
	result->extension_info = std::move(extension_info);
	return result;
}